

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

double Catch::Benchmark::Detail::weighted_average_quantile(int k,int q,double *first,double *last)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = (double)((long)k * (((long)last - (long)first >> 3) + -1)) / (double)q;
  dVar3 = dVar2 - (double)(int)dVar2;
  pdVar1 = first + (int)dVar2;
  std::nth_element<double*>(first,pdVar1,last);
  dVar2 = *pdVar1;
  if ((dVar3 != 0.0) || (NAN(dVar3))) {
    pdVar1 = std::__min_element<double*,__gnu_cxx::__ops::_Iter_less_iter>(pdVar1 + 1,last);
    dVar2 = dVar3 * (*pdVar1 - dVar2) + dVar2;
  }
  return dVar2;
}

Assistant:

double weighted_average_quantile( int k,
                                              int q,
                                              double* first,
                                              double* last ) {
                auto count = last - first;
                double idx = (count - 1) * k / static_cast<double>(q);
                int j = static_cast<int>(idx);
                double g = idx - j;
                std::nth_element(first, first + j, last);
                auto xj = first[j];
                if ( Catch::Detail::directCompare( g, 0 ) ) {
                    return xj;
                }

                auto xj1 = *std::min_element(first + (j + 1), last);
                return xj + g * (xj1 - xj);
            }